

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4menc.c
# Opt level: O0

int y4m_write_file_header
              (char *buf,size_t len,int width,int height,AvxRational *framerate,int monochrome,
              aom_chroma_sample_position_t csp,aom_img_fmt_t fmt,uint bit_depth,
              aom_color_range_t range)

{
  int iVar1;
  uint in_ECX;
  uint in_EDX;
  size_t in_RSI;
  char *in_RDI;
  uint *in_R8;
  int in_R9D;
  uint in_stack_00000018;
  char *color_range;
  char *color;
  char *local_40;
  char *local_38;
  undefined8 in_stack_ffffffffffffffd0;
  aom_chroma_sample_position_t in_stack_ffffffffffffffd8;
  
  if (in_R9D == 0) {
    local_40 = colorspace(0,in_stack_ffffffffffffffd8,
                          (aom_img_fmt_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  }
  else {
    local_40 = monochrome_colorspace(in_stack_00000018);
  }
  local_38 = "";
  if ((int)color_range == 1) {
    local_38 = " XCOLORRANGE=FULL";
  }
  iVar1 = snprintf(in_RDI,in_RSI,"YUV4MPEG2 W%d H%d F%d:%d Ip %s%s\n",(ulong)in_EDX,(ulong)in_ECX,
                   (ulong)*in_R8,in_R8[1],local_40,local_38);
  return iVar1;
}

Assistant:

int y4m_write_file_header(char *buf, size_t len, int width, int height,
                          const struct AvxRational *framerate, int monochrome,
                          aom_chroma_sample_position_t csp, aom_img_fmt_t fmt,
                          unsigned int bit_depth, aom_color_range_t range) {
  const char *color = monochrome ? monochrome_colorspace(bit_depth)
                                 : colorspace(bit_depth, csp, fmt);
  const char *color_range = "";  // Default assumption is studio range.
  if (range == AOM_CR_FULL_RANGE) {
    color_range = " XCOLORRANGE=FULL";
  }
  return snprintf(buf, len, "YUV4MPEG2 W%d H%d F%d:%d Ip %s%s\n", width, height,
                  framerate->numerator, framerate->denominator, color,
                  color_range);
}